

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

char read_u32(archive_read *a,uint32_t *pvalue)

{
  uchar *p;
  uint32_t *puVar1;
  int64_t iVar2;
  bool bVar3;
  ssize_t avail;
  ssize_t local_18;
  
  local_18 = -1;
  puVar1 = (uint32_t *)__archive_read_ahead(a,4,&local_18);
  if (puVar1 == (uint32_t *)0x0) {
    bVar3 = false;
  }
  else {
    *pvalue = *puVar1;
    iVar2 = __archive_read_consume(a,4);
    bVar3 = iVar2 == 4;
  }
  return bVar3;
}

Assistant:

static char read_u32(struct archive_read* a, uint32_t* pvalue) {
	const uint8_t* p;
	if(!read_ahead(a, 4, &p))
		return 0;

	*pvalue = archive_le32dec(p);
	return ARCHIVE_OK == consume(a, 4);
}